

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cc
# Opt level: O1

void __thiscall UdpSocket::UdpSocket(UdpSocket *this,uint16_t port)

{
  unique_ptr<timeval,_std::default_delete<timeval>_> *puVar1;
  timeval *ptVar2;
  fd_set *pfVar3;
  sockaddr_in *psVar4;
  timeval *ptVar5;
  fd_set *pfVar6;
  sockaddr_in *psVar7;
  pointer *__ptr;
  
  this->_port = port;
  puVar1 = &this->_read_time;
  (this->_read_time)._M_t.super___uniq_ptr_impl<timeval,_std::default_delete<timeval>_>._M_t.
  super__Tuple_impl<0UL,_timeval_*,_std::default_delete<timeval>_>.
  super__Head_base<0UL,_timeval_*,_false>._M_head_impl = (timeval *)0x0;
  (this->_readset)._M_t.super___uniq_ptr_impl<fd_set,_std::default_delete<fd_set>_>._M_t.
  super__Tuple_impl<0UL,_fd_set_*,_std::default_delete<fd_set>_>.
  super__Head_base<0UL,_fd_set_*,_false>._M_head_impl = (fd_set *)0x0;
  (this->_read_addr)._M_t.super___uniq_ptr_impl<sockaddr_in,_std::default_delete<sockaddr_in>_>._M_t
  .super__Tuple_impl<0UL,_sockaddr_in_*,_std::default_delete<sockaddr_in>_>.
  super__Head_base<0UL,_sockaddr_in_*,_false>._M_head_impl = (sockaddr_in *)0x0;
  this->_recv_speed_bytes = 0;
  this->_print_time_ms = 0;
  this->_prior_recv_time = 0;
  InitSocket(this);
  ptVar5 = (timeval *)operator_new(0x10);
  ptVar2 = (puVar1->_M_t).super___uniq_ptr_impl<timeval,_std::default_delete<timeval>_>._M_t.
           super__Tuple_impl<0UL,_timeval_*,_std::default_delete<timeval>_>.
           super__Head_base<0UL,_timeval_*,_false>._M_head_impl;
  (puVar1->_M_t).super___uniq_ptr_impl<timeval,_std::default_delete<timeval>_>._M_t.
  super__Tuple_impl<0UL,_timeval_*,_std::default_delete<timeval>_>.
  super__Head_base<0UL,_timeval_*,_false>._M_head_impl = ptVar5;
  if (ptVar2 != (timeval *)0x0) {
    operator_delete(ptVar2,0x10);
  }
  ptVar2 = (puVar1->_M_t).super___uniq_ptr_impl<timeval,_std::default_delete<timeval>_>._M_t.
           super__Tuple_impl<0UL,_timeval_*,_std::default_delete<timeval>_>.
           super__Head_base<0UL,_timeval_*,_false>._M_head_impl;
  ptVar2->tv_sec = 1;
  ptVar2->tv_usec = 0;
  pfVar6 = (fd_set *)operator_new(0x80);
  pfVar3 = (this->_readset)._M_t.super___uniq_ptr_impl<fd_set,_std::default_delete<fd_set>_>._M_t.
           super__Tuple_impl<0UL,_fd_set_*,_std::default_delete<fd_set>_>.
           super__Head_base<0UL,_fd_set_*,_false>._M_head_impl;
  (this->_readset)._M_t.super___uniq_ptr_impl<fd_set,_std::default_delete<fd_set>_>._M_t.
  super__Tuple_impl<0UL,_fd_set_*,_std::default_delete<fd_set>_>.
  super__Head_base<0UL,_fd_set_*,_false>._M_head_impl = pfVar6;
  if (pfVar3 != (fd_set *)0x0) {
    operator_delete(pfVar3,0x80);
  }
  psVar7 = (sockaddr_in *)operator_new(0x10);
  psVar4 = (this->_read_addr)._M_t.
           super___uniq_ptr_impl<sockaddr_in,_std::default_delete<sockaddr_in>_>._M_t.
           super__Tuple_impl<0UL,_sockaddr_in_*,_std::default_delete<sockaddr_in>_>.
           super__Head_base<0UL,_sockaddr_in_*,_false>._M_head_impl;
  (this->_read_addr)._M_t.super___uniq_ptr_impl<sockaddr_in,_std::default_delete<sockaddr_in>_>._M_t
  .super__Tuple_impl<0UL,_sockaddr_in_*,_std::default_delete<sockaddr_in>_>.
  super__Head_base<0UL,_sockaddr_in_*,_false>._M_head_impl = psVar7;
  if (psVar4 != (sockaddr_in *)0x0) {
    operator_delete(psVar4,0x10);
    return;
  }
  return;
}

Assistant:

UdpSocket::UdpSocket(uint16_t port)
	: _port(port)
{
	InitSocket();
	_read_time.reset(new timeval);
	_read_time->tv_sec = 1;
	_read_time->tv_usec = 0;
	_readset.reset(new fd_set);
	_read_addr.reset(new sockaddr_in);
}